

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sumInverse(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  int iVar1;
  SumCtx *pSum;
  i64 iVar2;
  double dVar3;
  
  pSum = (SumCtx *)sqlite3_aggregate_context(context,0x28);
  iVar1 = sqlite3_value_numeric_type(*argv);
  if (iVar1 != 5 && pSum != (SumCtx *)0x0) {
    pSum->cnt = pSum->cnt + -1;
    pMem = *argv;
    if (pSum->approx != '\0') {
      if (iVar1 == 1) {
        iVar2 = sqlite3VdbeIntValue(pMem);
        if (iVar2 != -0x8000000000000000) {
          kahanBabuskaNeumaierStepInt64(pSum,-iVar2);
          return;
        }
        kahanBabuskaNeumaierStepInt64(pSum,0x7fffffffffffffff);
        dVar3 = 1.0;
      }
      else {
        dVar3 = sqlite3VdbeRealValue(pMem);
        dVar3 = -dVar3;
      }
      kahanBabuskaNeumaierStep(pSum,dVar3);
      return;
    }
    iVar2 = sqlite3VdbeIntValue(pMem);
    iVar1 = sqlite3SubInt64(&pSum->iSum,iVar2);
    if (iVar1 != 0) {
      pSum->approx = '\x01';
      pSum->ovrfl = '\x01';
    }
  }
  return;
}

Assistant:

static void sumInverse(sqlite3_context *context, int argc, sqlite3_value**argv){
  SumCtx *p;
  int type;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  p = sqlite3_aggregate_context(context, sizeof(*p));
  type = sqlite3_value_numeric_type(argv[0]);
  /* p is always non-NULL because sumStep() will have been called first
  ** to initialize it */
  if( ALWAYS(p) && type!=SQLITE_NULL ){
    assert( p->cnt>0 );
    p->cnt--;
    if( !p->approx ){
      if( sqlite3SubInt64(&p->iSum, sqlite3_value_int64(argv[0])) ){
        p->ovrfl = 1;
        p->approx = 1;
      }
    }else if( type==SQLITE_INTEGER ){
      i64 iVal = sqlite3_value_int64(argv[0]);
      if( iVal!=SMALLEST_INT64 ){
        kahanBabuskaNeumaierStepInt64(p, -iVal);
      }else{
        kahanBabuskaNeumaierStepInt64(p, LARGEST_INT64);
        kahanBabuskaNeumaierStepInt64(p, 1);
      }
    }else{
      kahanBabuskaNeumaierStep(p, -sqlite3_value_double(argv[0]));
    }
  }
}